

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O0

void __thiscall
cmCommandArgumentGroup::FollowsGroup(cmCommandArgumentGroup *this,cmCommandArgumentGroup *group)

{
  bool bVar1;
  reference ppcVar2;
  __normal_iterator<cmCommandArgument_**,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
  local_28;
  __normal_iterator<cmCommandArgument_**,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
  local_20;
  iterator it;
  cmCommandArgumentGroup *group_local;
  cmCommandArgumentGroup *this_local;
  
  it._M_current = (cmCommandArgument **)group;
  local_20._M_current =
       (cmCommandArgument **)
       std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::begin
                 (&this->ContainedArguments);
  while( true ) {
    local_28._M_current =
         (cmCommandArgument **)
         std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::end
                   (&this->ContainedArguments);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmCommandArgument_**,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
              ::operator*(&local_20);
    cmCommandArgument::FollowsGroup(*ppcVar2,(cmCommandArgumentGroup *)it._M_current);
    __gnu_cxx::
    __normal_iterator<cmCommandArgument_**,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void cmCommandArgumentGroup::FollowsGroup(const cmCommandArgumentGroup* group)
{
  for(std::vector<cmCommandArgument*>::iterator
      it = this->ContainedArguments.begin();
      it != this->ContainedArguments.end();
      ++it)
    {
    (*it)->FollowsGroup(group);
    }
}